

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var instance;
  Var pvVar7;
  RecyclableObject *this_00;
  JavascriptPromise *promise;
  RecyclableObject *constructor;
  JavascriptMethod p_Var8;
  int32 hCode;
  int in_stack_00000010;
  Arguments local_98;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  JavascriptPromiseResolveOrRejectFunction *resolve;
  ArgumentReader args;
  JavascriptPromiseResolveOrRejectFunction *reject;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  reject = (JavascriptPromiseResolveOrRejectFunction *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x19,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b9a4b9;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&resolve,(CallInfo *)&reject,(Var *)&stack0x00000018);
  if (((uint)resolve & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00b9a4b9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  callInfo_local = (CallInfo)(pSVar1->super_ScriptContextBase).javascriptLibrary;
  instance = Arguments::GetNewTarget((Arguments *)&resolve);
  local_98.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_98);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,(CallInfo)reject,L"Promise",
             &stack0x00000000);
  hCode = -0x7ff5ea00;
  if (((ulong)reject & 0x1000000) != 0) {
    if (instance != (Var)0x0) {
      BVar5 = JavascriptOperators::IsUndefined(instance);
      if (BVar5 != 0) goto LAB_00b9a4a7;
    }
    hCode = -0x7ff5ec34;
    if (((uint)resolve & 0xfffffe) != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&resolve,1);
      bVar4 = JavascriptConversion::IsCallable(pvVar7);
      if (bVar4) {
        pvVar7 = Arguments::operator[]((Arguments *)&resolve,1);
        this_00 = VarTo<Js::RecyclableObject>(pvVar7);
        promise = JavascriptLibrary::CreatePromise((JavascriptLibrary *)callInfo_local);
        if (bVar3) {
          constructor = VarTo<Js::RecyclableObject>(instance);
          JavascriptOperators::OrdinaryCreateFromConstructor
                    (constructor,(RecyclableObject *)promise,
                     *(DynamicObject **)((long)callInfo_local + 0x318),pSVar1);
        }
        InitializePromise(promise,(JavascriptPromiseResolveOrRejectFunction **)&__tag.entry.next,
                          (JavascriptPromiseResolveOrRejectFunction **)&args.super_Arguments.Values,
                          pSVar1);
        this = pSVar1->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
        p_Var8 = RecyclableObject::GetEntryPoint(this_00);
        CheckIsExecutable(this_00,p_Var8);
        p_Var8 = RecyclableObject::GetEntryPoint(this_00);
        (*p_Var8)(this_00,(CallInfo)this_00,0x2000003,0,0,0,0,0x2000003,
                  *(undefined8 *)((long)callInfo_local + 0x430),__tag.entry.next,
                  args.super_Arguments.Values);
        this->reentrancySafeOrHandled = bVar3;
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_88)
        ;
        return promise;
      }
    }
  }
LAB_00b9a4a7:
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Promise");
}

Assistant:

Var JavascriptPromise::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Promise, scriptContext);

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise"));

        // 1. If NewTarget is undefined, throw a TypeError exception.
        if ((callInfo.Flags & CallFlags_New) != CallFlags_New || (newTarget != nullptr && JavascriptOperators::IsUndefined(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("Promise"));
        }

        // 2. If IsCallable(executor) is false, throw a TypeError exception.
        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise"));
        }
        RecyclableObject* executor = VarTo<RecyclableObject>(args[1]);

        // 3. Let promise be ? OrdinaryCreateFromConstructor(NewTarget, "%PromisePrototype%", <<[[PromiseState]], [[PromiseResult]], [[PromiseFulfillReactions]], [[PromiseRejectReactions]], [[PromiseIsHandled]] >>).
        JavascriptPromise* promise = library->CreatePromise();
        if (isCtorSuperCall)
        {
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), promise, library->GetPromisePrototype(), scriptContext);
        }

        JavascriptPromiseResolveOrRejectFunction* resolve;
        JavascriptPromiseResolveOrRejectFunction* reject;

        // 4. Set promise's [[PromiseState]] internal slot to "pending".
        // 5. Set promise's [[PromiseFulfillReactions]] internal slot to a new empty List.
        // 6. Set promise's [[PromiseRejectReactions]] internal slot to a new empty List.
        // 7. Set promise's [[PromiseIsHandled]] internal slot to false.
        // 8. Let resolvingFunctions be CreateResolvingFunctions(promise).
        InitializePromise(promise, &resolve, &reject, scriptContext);

        JavascriptExceptionObject* exception = nullptr;

        // 9. Let completion be Call(executor, undefined, << resolvingFunctions.[[Resolve]], resolvingFunctions.[[Reject]] >>).
        try
        {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                        executor, CallInfo(CallFlags_Value, 3),
                        library->GetUndefined(),
                        resolve,
                        reject);
            }
            END_SAFE_REENTRANT_CALL
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            // 10. If completion is an abrupt completion, then
            //    a. Perform ? Call(resolvingFunctions.[[Reject]], undefined, << completion.[[Value]] >>).
            TryRejectWithExceptionObject(exception, reject, scriptContext);
        }

        // 11. Return promise.
        return promise;
    }